

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

void __thiscall
lzham::search_accelerator::search_accelerator
          (search_accelerator *this,lzham_malloc_context malloc_context)

{
  undefined8 *puVar1;
  long lVar2;
  vector<unsigned_int> *this_00;
  bool bVar3;
  
  this->m_malloc_context = malloc_context;
  this->m_pLZBase = (CLZBase *)0x0;
  this->m_pTask_pool = (task_pool *)0x0;
  this->m_max_helper_threads = 0;
  this->m_max_dict_size = 0;
  this->m_max_dict_size_mask = 0;
  this->m_lookahead_pos = 0;
  this->m_lookahead_size = 0;
  this->m_cur_dict_size = 0;
  (this->m_dict).m_p = (uchar *)0x0;
  (this->m_dict).m_size = 0;
  (this->m_dict).m_capacity = 0;
  (this->m_dict).m_malloc_context = malloc_context;
  (this->m_hash).m_p = (uint *)0x0;
  (this->m_hash).m_size = 0;
  (this->m_hash).m_capacity = 0;
  (this->m_hash).m_malloc_context = malloc_context;
  (this->m_nodes).m_p = (node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_nodes).m_malloc_context = malloc_context;
  (this->m_matches).m_p = (dict_match *)0x0;
  (this->m_matches).m_size = 0;
  (this->m_matches).m_capacity = 0;
  (this->m_matches).m_malloc_context = malloc_context;
  (this->m_match_refs).m_p = (long *)0x0;
  (this->m_match_refs).m_size = 0;
  (this->m_match_refs).m_capacity = 0;
  (this->m_match_refs).m_malloc_context = malloc_context;
  (this->m_digram_hash).m_p = (uint *)0x0;
  (this->m_digram_hash).m_size = 0;
  (this->m_digram_hash).m_capacity = 0;
  (this->m_digram_hash).m_malloc_context = malloc_context;
  (this->m_digram_next).m_p = (uint *)0x0;
  (this->m_digram_next).m_size = 0;
  (this->m_digram_next).m_capacity = 0;
  (this->m_digram_next).m_malloc_context = malloc_context;
  lVar2 = 0xd8;
  do {
    *(undefined8 *)((long)&this->m_pTask_pool + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->m_malloc_context + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x3d8);
  this_00 = this->m_thread_dict_offsets;
  this->m_fill_lookahead_pos = 0;
  this->m_fill_lookahead_size = 0;
  this->m_fill_dict_size = 0;
  this->m_max_probes = 0;
  this->m_max_matches = 0;
  this->m_all_matches = false;
  this->m_deterministic = false;
  this->m_len2_matches = false;
  this->m_hash24 = false;
  this->m_next_match_ref = 0;
  this->m_num_completed_helper_threads = 0;
  lVar2 = 0x20;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    vector<unsigned_int>::clear(this_00);
    this_00->m_malloc_context = malloc_context;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

search_accelerator::search_accelerator(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_pLZBase(NULL),
      m_pTask_pool(NULL),
      m_max_helper_threads(0),
      m_max_dict_size(0),
      m_max_dict_size_mask(0),
      m_lookahead_pos(0),
      m_lookahead_size(0),
      m_cur_dict_size(0),
      m_dict(malloc_context), 
      m_hash(malloc_context), 
      m_nodes(malloc_context), 
      m_matches(malloc_context), 
      m_match_refs(malloc_context), 
      m_digram_hash(malloc_context),
      m_digram_next(malloc_context),
      m_fill_lookahead_pos(0),
      m_fill_lookahead_size(0),
      m_fill_dict_size(0),
      m_max_probes(0),
      m_max_matches(0),
      m_all_matches(false),
      m_deterministic(false),
      m_len2_matches(false),
      m_hash24(false),
      m_next_match_ref(0),
      m_num_completed_helper_threads(0)
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_thread_dict_offsets); i++)
         m_thread_dict_offsets[i].set_malloc_context(malloc_context);
   }